

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeAllEquivalencesWithDeletedVariable_Test::TestBody
          (Variable_removeAllEquivalencesWithDeletedVariable_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  unsigned_long local_1b8 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_188 [8];
  Message local_180 [8];
  unsigned_long local_178 [2];
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  AssertHelper local_138 [8];
  Message local_130 [15];
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0 [8];
  Message local_e8 [15];
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  string local_c0 [32];
  undefined1 local_a0 [8];
  VariablePtr v3;
  string local_88 [32];
  undefined1 local_68 [8];
  VariablePtr v2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  VariablePtr v1;
  Variable_removeAllEquivalencesWithDeletedVariable_Test *this_local;
  
  v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"var1",&local_41);
  libcellml::Variable::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"var2",
             (allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"var2",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = libcellml::Variable::addEquivalence((shared_ptr *)local_20,(shared_ptr *)local_68);
  local_d9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_d8,
               "libcellml::Variable::addEquivalence(v1, v2)","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x5a6,pcVar3);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  bVar1 = libcellml::Variable::addEquivalence((shared_ptr *)local_20,(shared_ptr *)local_a0);
  local_121 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_120,
               "libcellml::Variable::addEquivalence(v1, v3)","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x5a7,pcVar3);
    testing::internal::AssertHelper::operator=(local_138,local_130);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_178[1] = 2;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  local_178[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_168,"size_t(2)","v1->equivalentVariableCount()",local_178 + 1,
             local_178);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x5a9,pcVar3);
    testing::internal::AssertHelper::operator=(local_188,local_180);
    testing::internal::AssertHelper::~AssertHelper(local_188);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  this_00 = &gtest_ar_1.message_;
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)this_00,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::operator=
            ((shared_ptr<libcellml::Variable> *)local_a0,(shared_ptr<libcellml::Variable> *)this_00)
  ;
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)this_00);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::removeAllEquivalences();
  local_1b8[1] = 0;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  local_1b8[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1a8,"size_t(0)","v1->equivalentVariableCount()",local_1b8 + 1,
             local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x5af,pcVar3);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_68);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_20);
  return;
}

Assistant:

TEST(Variable, removeAllEquivalencesWithDeletedVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("var1");
    libcellml::VariablePtr v2 = libcellml::Variable::create("var2");
    libcellml::VariablePtr v3 = libcellml::Variable::create("var2");

    EXPECT_TRUE(libcellml::Variable::addEquivalence(v1, v2));
    EXPECT_TRUE(libcellml::Variable::addEquivalence(v1, v3));

    EXPECT_EQ(size_t(2), v1->equivalentVariableCount());

    v3 = nullptr;

    v1->removeAllEquivalences();

    EXPECT_EQ(size_t(0), v1->equivalentVariableCount());
}